

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void CombinationKeygenRecurse<Blob<160>,block32>
               (block32 *key,int len,int maxlen,block32 *blocks,int blockcount,pfHash hash,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  block32 *pbVar5;
  long lVar6;
  Blob<160> h;
  Blob<160> local_44;
  
  if (len != maxlen) {
    pbVar5 = key + len;
    for (lVar6 = 0; (ulong)(uint)(~(blockcount >> 0x1f) & blockcount) << 5 != lVar6;
        lVar6 = lVar6 + 0x20) {
      pcVar1 = blocks->c + lVar6;
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      uVar4 = *(undefined8 *)(pcVar1 + 0x18);
      *(undefined8 *)pbVar5->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(pbVar5->c + 8) = uVar2;
      *(undefined8 *)(pbVar5->c + 0x10) = uVar3;
      *(undefined8 *)(pbVar5->c + 0x18) = uVar4;
      Blob<160>::Blob(&local_44);
      (*hash)(key,(len + 1) * 0x20,0,&local_44);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,&local_44);
      CombinationKeygenRecurse<Blob<160>,block32>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}